

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86func.cpp
# Opt level: O3

Error asmjit::x86::FuncInternal::initFuncDetail
                (FuncDetail *func,FuncSignature *signature,uint32_t registerSize)

{
  byte *pbVar1;
  FuncValuePack *pack;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  FuncValue *pFVar6;
  int iVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint32_t valueIndex;
  size_t sVar14;
  uint32_t valueIndex_1;
  ulong uVar15;
  int iVar16;
  
  bVar2 = (func->_callConv)._spillZoneSize;
  bVar3 = func->_argCount;
  if ((func->_rets)._values[0]._data != 0) {
    pack = &func->_rets;
    bVar4 = (func->_callConv)._arch;
    unpackValues(func,pack);
    iVar7 = 0x15000000;
    if ((bVar4 & 1) == 0) {
      iVar7 = 0xb000000;
    }
    iVar16 = 0x15000100;
    for (uVar15 = 0; uVar15 != 4; uVar15 = uVar15 + 1) {
      pFVar6 = FuncValuePack::operator[](pack,uVar15);
      bVar5 = (byte)pFVar6->_data;
      uVar10 = (uint)bVar5;
      switch(bVar5) {
      case 0x22:
      case 0x24:
      case 0x26:
        if (1 < uVar15) {
          return 3;
        }
        pFVar6 = FuncValuePack::operator[](pack,uVar15);
        uVar9 = (uint)""[uVar15] << 0x10 | 0x5000126;
        break;
      case 0x23:
      case 0x25:
      case 0x27:
        if (1 < uVar15) {
          return 3;
        }
        pFVar6 = FuncValuePack::operator[](pack,uVar15);
        uVar9 = (uint)""[uVar15] << 0x10 | 0x5000127;
        break;
      case 0x28:
      case 0x29:
        if (1 < uVar15) {
          return 3;
        }
        pFVar6 = FuncValuePack::operator[](pack,uVar15);
        uVar9 = (uint)""[uVar15] * 0x10000 + uVar10 + 0x6000100;
        break;
      case 0x2a:
      case 0x2b:
        pFVar6 = FuncValuePack::operator[](pack,uVar15);
        uVar9 = iVar7 + iVar16 + uVar10 + 0xeb000000;
        break;
      case 0x2c:
        pFVar6 = FuncValuePack::operator[](pack,uVar15);
        pFVar6->_data = uVar10 + iVar16;
        goto LAB_0012da4d;
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x30:
        goto switchD_0012d913_caseD_2d;
      case 0x31:
      case 0x32:
        if ((bVar4 & 1) == 0) {
          if ((func->_callConv)._strategy == '\0') {
            uVar8 = 0xb000000;
            goto LAB_0012da61;
          }
          if (1 < uVar15) {
            return 3;
          }
          uVar11 = (uint)""[uVar15];
          uVar8 = 0x6000000;
        }
        else {
          uVar8 = 0xf000000;
LAB_0012da61:
          uVar11 = (uint)uVar15;
        }
        pFVar6 = FuncValuePack::operator[](pack,uVar15);
        pFVar6->_data = uVar10 + (uVar11 << 0x10 | uVar8) + 0x100;
        goto LAB_0012da4d;
      default:
        if (uVar10 == 0) goto LAB_0012da8d;
switchD_0012d913_caseD_2d:
        pFVar6 = FuncValuePack::operator[](pack,uVar15);
        uVar8 = (0x5a < uVar10 | 0xc) << 0x18;
        if (uVar10 < 0x51) {
          uVar8 = 0xb000000;
        }
        uVar9 = (uVar8 | uVar10) + iVar16 + 0xeb000000;
      }
      pFVar6->_data = uVar9;
LAB_0012da4d:
      iVar16 = iVar16 + 0x10000;
    }
  }
LAB_0012da8d:
  uVar10 = (uint)bVar2;
  bVar2 = (func->_callConv)._strategy;
  if (bVar2 - 1 < 2) {
    for (uVar15 = 0; uVar15 != bVar3; uVar15 = uVar15 + 1) {
      unpackValues(func,func->_args + uVar15);
      for (sVar14 = 0; sVar14 != 4; sVar14 = sVar14 + 1) {
        pFVar6 = FuncValuePack::operator[](func->_args + uVar15,sVar14);
        uVar8 = pFVar6->_data;
        if (uVar8 == 0) break;
        uVar11 = uVar8 & 0xff;
        uVar9 = Type::sizeOf(uVar11);
        if (uVar11 - 0x31 < 2 || uVar11 - 0x20 < 10) {
          if (uVar15 < 0x10) {
            bVar4 = (func->_callConv)._passedOrder[0].id[uVar15];
            if (bVar4 != 0xff) {
              uVar12 = (uVar11 - 0x31 < 2) + 5;
              if (4 < uVar9) {
                uVar12 = 6;
              }
              FuncValue::assignRegData(pFVar6,uVar12,(uint)bVar4);
              func->_usedRegs[0] = func->_usedRegs[0] | 1 << (bVar4 & 0x1f);
              goto LAB_0012dc62;
            }
          }
          FuncValue::assignStackOffset(pFVar6,uVar10);
LAB_0012dc5f:
          uVar10 = uVar10 + 8;
        }
        else {
          uVar13 = uVar11 - 0x2a;
          if (uVar11 - 0x33 < 0x32 || uVar13 < 3) {
            if (((0xf < uVar15) || (bVar2 != 2 && 2 < uVar13)) ||
               (bVar4 = (func->_callConv)._passedOrder[0].id[uVar15 + 0x10], bVar4 == 0xff)) {
              if (uVar13 < 3) {
                FuncValue::assignStackOffset(pFVar6,uVar10);
              }
              else {
                uVar8 = (uint)(func->_callConv)._passedOrder[0].id[uVar15];
                if (uVar8 == 0xff) {
                  FuncValue::assignStackOffset(pFVar6,uVar10);
                }
                else {
                  FuncValue::assignRegData(pFVar6,6,uVar8);
                }
                pbVar1 = (byte *)((long)&pFVar6->_data + 1);
                *pbVar1 = *pbVar1 | 4;
              }
              goto LAB_0012dc5f;
            }
            uVar9 = 0xd - ((uVar8 & 0xff) < 0x5b);
            if (uVar11 < 0x51) {
              uVar9 = 0xb;
            }
            FuncValue::assignRegData(pFVar6,uVar9,(uint)bVar4);
            func->_usedRegs[1] = func->_usedRegs[1] | 1 << (bVar4 & 0x1f);
          }
        }
LAB_0012dc62:
      }
    }
  }
  else if (bVar2 == 0) {
    uVar8 = 0;
    uVar11 = 0;
    for (uVar15 = 0; uVar15 != bVar3; uVar15 = uVar15 + 1) {
      unpackValues(func,func->_args + uVar15);
      for (sVar14 = 0; sVar14 != 4; sVar14 = sVar14 + 1) {
        pFVar6 = FuncValuePack::operator[](func->_args + uVar15,sVar14);
        if (pFVar6->_data == 0) break;
        uVar13 = pFVar6->_data & 0xff;
        if (uVar13 - 0x20 < 10) {
          if (uVar11 < 0x10) {
            bVar2 = (func->_callConv)._passedOrder[0].id[uVar11];
            if (bVar2 != 0xff) {
              FuncValue::assignRegData(pFVar6,6 - (uVar13 < 0x28),(uint)bVar2);
              func->_usedRegs[0] = func->_usedRegs[0] | 1 << (bVar2 & 0x1f);
              uVar11 = uVar11 + 1;
              goto LAB_0012ddfc;
            }
          }
          uVar9 = Type::sizeOf(uVar13);
          if (uVar9 <= registerSize) {
            uVar9 = registerSize;
          }
LAB_0012ddeb:
          FuncValue::assignStackOffset(pFVar6,uVar10);
          uVar10 = uVar10 + uVar9;
        }
        else if (uVar13 - 0x33 < 0x32 || uVar13 - 0x2a < 3) {
          uVar9 = 0xff;
          if (uVar8 < 0x10) {
            uVar9 = (uint32_t)(func->_callConv)._passedOrder[0].id[(ulong)uVar8 + 0x10];
          }
          if (uVar13 - 0x2a < 3) {
            if (((func->_callConv)._flags & 4) != 0) {
LAB_0012dda2:
              if (uVar9 != 0xff) {
                uVar12 = 0xd - (uVar13 < 0x5b);
                pFVar6->_data = uVar13;
                if (uVar13 < 0x51) {
                  uVar12 = 0xb;
                }
                FuncValue::assignRegData(pFVar6,uVar12,uVar9);
                func->_usedRegs[1] = func->_usedRegs[1] | 1 << ((byte)uVar9 & 0x1f);
                uVar8 = uVar8 + 1;
                goto LAB_0012ddfc;
              }
            }
          }
          else if ((signature->_vaIndex == 0xff) || (((func->_callConv)._flags & 8) == 0))
          goto LAB_0012dda2;
          uVar9 = Type::sizeOf(uVar13);
          goto LAB_0012ddeb;
        }
LAB_0012ddfc:
      }
    }
  }
  func->_argStackSize = uVar10;
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error initFuncDetail(FuncDetail& func, const FuncSignature& signature, uint32_t registerSize) noexcept {
  const CallConv& cc = func.callConv();
  uint32_t arch = cc.arch();
  uint32_t stackOffset = cc._spillZoneSize;
  uint32_t argCount = func.argCount();

  // Up to two return values can be returned in GP registers.
  static const uint8_t gpReturnIndexes[4] = {
    uint8_t(Gp::kIdAx),
    uint8_t(Gp::kIdDx),
    uint8_t(BaseReg::kIdBad),
    uint8_t(BaseReg::kIdBad)
  };

  if (func.hasRet()) {
    unpackValues(func, func._rets);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      uint32_t typeId = func._rets[valueIndex].typeId();

      // Terminate at the first void type (end of the pack).
      if (!typeId)
        break;

      switch (typeId) {
        case Type::kIdI64:
        case Type::kIdU64: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(Reg::kTypeGpq, gpReturnIndexes[valueIndex], typeId);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case Type::kIdI8:
        case Type::kIdI16:
        case Type::kIdI32: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(Reg::kTypeGpd, gpReturnIndexes[valueIndex], Type::kIdI32);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case Type::kIdU8:
        case Type::kIdU16:
        case Type::kIdU32: {
          if (gpReturnIndexes[valueIndex] != BaseReg::kIdBad)
            func._rets[valueIndex].initReg(Reg::kTypeGpd, gpReturnIndexes[valueIndex], Type::kIdU32);
          else
            return DebugUtils::errored(kErrorInvalidState);
          break;
        }

        case Type::kIdF32:
        case Type::kIdF64: {
          uint32_t regType = Environment::is32Bit(arch) ? Reg::kTypeSt : Reg::kTypeXmm;
          func._rets[valueIndex].initReg(regType, valueIndex, typeId);
          break;
        }

        case Type::kIdF80: {
          // 80-bit floats are always returned by FP0.
          func._rets[valueIndex].initReg(Reg::kTypeSt, valueIndex, typeId);
          break;
        }

        case Type::kIdMmx32:
        case Type::kIdMmx64: {
          // MM registers are returned through XMM (SystemV) or GPQ (Win64).
          uint32_t regType = Reg::kTypeMm;
          uint32_t regIndex = valueIndex;
          if (Environment::is64Bit(arch)) {
            regType = cc.strategy() == CallConv::kStrategyDefault ? Reg::kTypeXmm : Reg::kTypeGpq;
            regIndex = cc.strategy() == CallConv::kStrategyDefault ? valueIndex : gpReturnIndexes[valueIndex];

            if (regIndex == BaseReg::kIdBad)
              return DebugUtils::errored(kErrorInvalidState);
          }

          func._rets[valueIndex].initReg(regType, regIndex, typeId);
          break;
        }

        default: {
          func._rets[valueIndex].initReg(vecTypeIdToRegType(typeId), valueIndex, typeId);
          break;
        }
      }
    }
  }

  switch (cc.strategy()) {
    case CallConv::kStrategyDefault: {
      uint32_t gpzPos = 0;
      uint32_t vecPos = 0;

      for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
        unpackValues(func, func._args[argIndex]);

        for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
          FuncValue& arg = func._args[argIndex][valueIndex];

          // Terminate if there are no more arguments in the pack.
          if (!arg)
            break;

          uint32_t typeId = arg.typeId();

          if (Type::isInt(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (gpzPos < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[Reg::kGroupGp].id[gpzPos];

            if (regId != BaseReg::kIdBad) {
              uint32_t regType = (typeId <= Type::kIdU32) ? Reg::kTypeGpd : Reg::kTypeGpq;
              arg.assignRegData(regType, regId);
              func.addUsedRegs(Reg::kGroupGp, Support::bitMask(regId));
              gpzPos++;
            }
            else {
              uint32_t size = Support::max<uint32_t>(Type::sizeOf(typeId), registerSize);
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += size;
            }
            continue;
          }

          if (Type::isFloat(typeId) || Type::isVec(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (vecPos < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[Reg::kGroupVec].id[vecPos];

            if (Type::isFloat(typeId)) {
              // If this is a float, but `kFlagPassFloatsByVec` is false, we have
              // to use stack instead. This should be only used by 32-bit calling
              // conventions.
              if (!cc.hasFlag(CallConv::kFlagPassFloatsByVec))
                regId = BaseReg::kIdBad;
            }
            else {
              // Pass vector registers via stack if this is a variable arguments
              // function. This should be only used by 32-bit calling conventions.
              if (signature.hasVarArgs() && cc.hasFlag(CallConv::kFlagPassVecByStackIfVA))
                regId = BaseReg::kIdBad;
            }

            if (regId != BaseReg::kIdBad) {
              arg.initTypeId(typeId);
              arg.assignRegData(vecTypeIdToRegType(typeId), regId);
              func.addUsedRegs(Reg::kGroupVec, Support::bitMask(regId));
              vecPos++;
            }
            else {
              uint32_t size = Type::sizeOf(typeId);
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += size;
            }
            continue;
          }
        }
      }
      break;
    }

    case CallConv::kStrategyX64Windows:
    case CallConv::kStrategyX64VectorCall: {
      // Both X64 and VectorCall behave similarly - arguments are indexed
      // from left to right. The position of the argument determines in
      // which register the argument is allocated, so it's either GP or
      // one of XMM/YMM/ZMM registers.
      //
      //       [       X64       ] [VecCall]
      // Index: #0   #1   #2   #3   #4   #5
      //
      // GP   : RCX  RDX  R8   R9
      // VEC  : XMM0 XMM1 XMM2 XMM3 XMM4 XMM5
      //
      // For example function `f(int a, double b, int c, double d)` will be:
      //
      //        (a)  (b)  (c)  (d)
      //        RCX  XMM1 R8   XMM3
      //
      // Unused vector registers are used by HVA.
      bool isVectorCall = (cc.strategy() == CallConv::kStrategyX64VectorCall);

      for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
        unpackValues(func, func._args[argIndex]);

        for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
          FuncValue& arg = func._args[argIndex][valueIndex];

          // Terminate if there are no more arguments in the pack.
          if (!arg)
            break;

          uint32_t typeId = arg.typeId();
          uint32_t size = Type::sizeOf(typeId);

          if (Type::isInt(typeId) || Type::isMmx(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (argIndex < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[Reg::kGroupGp].id[argIndex];

            if (regId != BaseReg::kIdBad) {
              uint32_t regType = (size <= 4 && !Type::isMmx(typeId)) ? Reg::kTypeGpd : Reg::kTypeGpq;
              arg.assignRegData(regType, regId);
              func.addUsedRegs(Reg::kGroupGp, Support::bitMask(regId));
            }
            else {
              arg.assignStackOffset(int32_t(stackOffset));
              stackOffset += 8;
            }
            continue;
          }

          if (Type::isFloat(typeId) || Type::isVec(typeId)) {
            uint32_t regId = BaseReg::kIdBad;

            if (argIndex < CallConv::kMaxRegArgsPerGroup)
              regId = cc._passedOrder[Reg::kGroupVec].id[argIndex];

            if (regId != BaseReg::kIdBad) {
              // X64-ABI doesn't allow vector types (XMM|YMM|ZMM) to be passed
              // via registers, however, VectorCall was designed for that purpose.
              if (Type::isFloat(typeId) || isVectorCall) {
                uint32_t regType = vecTypeIdToRegType(typeId);
                arg.assignRegData(regType, regId);
                func.addUsedRegs(Reg::kGroupVec, Support::bitMask(regId));
                continue;
              }
            }

            // Passed via stack if the argument is float/double or indirectly.
            // The trap is - if the argument is passed indirectly, the address
            // can be passed via register, if the argument's index has GP one.
            if (Type::isFloat(typeId)) {
              arg.assignStackOffset(int32_t(stackOffset));
            }
            else {
              uint32_t gpRegId = cc._passedOrder[Reg::kGroupGp].id[argIndex];
              if (gpRegId != BaseReg::kIdBad)
                arg.assignRegData(Reg::kTypeGpq, gpRegId);
              else
                arg.assignStackOffset(int32_t(stackOffset));
              arg.addFlags(FuncValue::kFlagIsIndirect);
            }

            // Always 8 bytes (float/double/pointer).
            stackOffset += 8;
            continue;
          }
        }
      }
      break;
    }
  }

  func._argStackSize = stackOffset;
  return kErrorOk;
}